

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O2

char inside_shop(level *lev,xchar x,xchar y)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  undefined7 in_register_00000011;
  undefined7 in_register_00000031;
  
  uVar1 = *(uint *)&lev->locations[(int)CONCAT71(in_register_00000031,x)]
                    [(int)CONCAT71(in_register_00000011,y)].field_0x6;
  uVar3 = uVar1 >> 0x10 & 0x3f;
  bVar2 = 0;
  if (((uVar1 >> 0x16 & 1) == 0 && 2 < uVar3) && (bVar2 = 0, '\x11' < lev->rooms[uVar3 - 3].rtype))
  {
    bVar2 = (byte)(uVar1 >> 0x10) & 0x3f;
  }
  return bVar2;
}

Assistant:

char inside_shop(struct level *lev, xchar x, xchar y)
{
	char rno;

	rno = lev->locations[x][y].roomno;
	if ((rno < ROOMOFFSET) || lev->locations[x][y].edge || !IS_SHOP(lev, rno-ROOMOFFSET))
	    return NO_ROOM;
	else
	    return rno;
}